

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereEqualScanEst(Parse *pParse,WhereLoopBuilder *pBuilder,Expr *pExpr,tRowcnt *pnRow)

{
  ushort uVar1;
  Parse *pParse_00;
  int iVar2;
  tRowcnt tVar3;
  tRowcnt *aStat;
  int bOk;
  UnpackedRecord *pRec;
  tRowcnt a [2];
  int local_3c;
  Index *local_38;
  undefined1 local_30 [4];
  tRowcnt local_2c;
  
  pParse_00 = (Parse *)(pBuilder->pNew->u).btree.pIndex;
  uVar1 = (pBuilder->pNew->u).btree.nEq;
  local_38 = (Index *)pBuilder->pRec;
  iVar2 = 0xc;
  if ((int)(uVar1 - 1) <= pBuilder->nRecValid) {
    tVar3 = 1;
    if (uVar1 < *(ushort *)&(pParse_00->constraintName).z) {
      aStat = (tRowcnt *)0x1;
      iVar2 = sqlite3Stat4ProbeSetValue
                        (pParse,(Index *)pParse_00,(UnpackedRecord **)&local_38,pExpr,1,uVar1 - 1,
                         &local_3c);
      pBuilder->pRec = (UnpackedRecord *)local_38;
      if (iVar2 != 0) {
        return iVar2;
      }
      if (local_3c == 0) {
        return 0xc;
      }
      pBuilder->nRecValid = (uint)uVar1;
      whereKeyStats(pParse_00,local_38,(UnpackedRecord *)0x0,(int)local_30,aStat);
      tVar3 = local_2c;
    }
    *pnRow = tVar3;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int whereEqualScanEst(
  Parse *pParse,       /* Parsing & code generating context */
  WhereLoopBuilder *pBuilder,
  Expr *pExpr,         /* Expression for VALUE in the x=VALUE constraint */
  tRowcnt *pnRow       /* Write the revised row estimate here */
){
  Index *p = pBuilder->pNew->u.btree.pIndex;
  int nEq = pBuilder->pNew->u.btree.nEq;
  UnpackedRecord *pRec = pBuilder->pRec;
  int rc;                   /* Subfunction return code */
  tRowcnt a[2];             /* Statistics */
  int bOk;

  assert( nEq>=1 );
  assert( nEq<=p->nColumn );
  assert( p->aSample!=0 );
  assert( p->nSample>0 );
  assert( pBuilder->nRecValid<nEq );

  /* If values are not available for all fields of the index to the left
  ** of this one, no estimate can be made. Return SQLITE_NOTFOUND. */
  if( pBuilder->nRecValid<(nEq-1) ){
    return SQLITE_NOTFOUND;
  }

  /* This is an optimization only. The call to sqlite3Stat4ProbeSetValue()
  ** below would return the same value.  */
  if( nEq>=p->nColumn ){
    *pnRow = 1;
    return SQLITE_OK;
  }

  rc = sqlite3Stat4ProbeSetValue(pParse, p, &pRec, pExpr, 1, nEq-1, &bOk);
  pBuilder->pRec = pRec;
  if( rc!=SQLITE_OK ) return rc;
  if( bOk==0 ) return SQLITE_NOTFOUND;
  pBuilder->nRecValid = nEq;

  whereKeyStats(pParse, p, pRec, 0, a);
  WHERETRACE(0x10,("equality scan regions %s(%d): %d\n",
                   p->zName, nEq-1, (int)a[1]));
  *pnRow = a[1];
  
  return rc;
}